

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdGenerateMipmap2D
          (CommandBuffer *this,Ptr<ImageBase> *image,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage,VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask
          ,VkImageLayout old_layout,VkImageLayout new_layout)

{
  VkImage pVVar1;
  Ptr<ImageBase> *pPVar2;
  VkAccessFlags VVar3;
  VkPipelineStageFlags VVar4;
  uint32_t uVar5;
  VkImageLayout old_layout_00;
  uint32_t uVar6;
  ImageBase *pIVar7;
  uint uVar8;
  uint uVar9;
  initializer_list<VkImageSubresourceLayers> __l;
  initializer_list<VkImageSubresourceLayers> __l_00;
  initializer_list<VkImageSubresourceLayers> __l_01;
  initializer_list<VkImageSubresourceLayers> __l_02;
  initializer_list<VkImageSubresourceLayers> __l_03;
  allocator_type local_f9;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_f8;
  VkPipelineStageFlags local_dc;
  VkAccessFlags local_d8;
  VkAccessFlags local_d4;
  vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> local_d0;
  VkPipelineStageFlags local_b4;
  Ptr<ImageBase> *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  pointer local_88;
  long lStack_80;
  uint32_t uStack_78;
  uint32_t uStack_74;
  VkImageSubresourceLayers VStack_70;
  undefined1 auStack_60 [16];
  uint uStack_50;
  uint32_t uStack_4c;
  uint local_48;
  uint32_t uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pIVar7 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (pIVar7->m_mip_levels != 0) {
    local_dc = dst_stage;
    local_d8 = dst_access_mask;
    local_d4 = src_access_mask;
    local_b4 = src_stage;
    local_b0 = image;
    if (pIVar7->m_mip_levels == 1) {
      local_d0.
      super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = pIVar7->m_array_layers;
      local_d0.
      super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      local_d0.
      super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_d0;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 &local_f8,__l,(allocator_type *)local_a8);
      ImageBase::GetMemoryBarriers
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)local_98,
                 pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                         *)&local_f8,local_d4,local_d8,old_layout,new_layout,0xffffffff,0xffffffff);
      (*vkCmdPipelineBarrier)
                (this->m_command_buffer,local_b4,local_dc,0,0,(VkMemoryBarrier *)0x0,0,
                 (VkBufferMemoryBarrier *)0x0,
                 (int)((ulong)(local_98._8_8_ - local_98._0_8_) >> 3) * 0x38e38e39,
                 (VkImageMemoryBarrier *)local_98._0_8_);
      if ((VkImageMemoryBarrier *)local_98._0_8_ != (VkImageMemoryBarrier *)0x0) {
        operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
      }
      if (local_f8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
          _M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
        operator_delete(local_f8.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      local_48 = (pIVar7->m_extent).width;
      uStack_44 = (pIVar7->m_extent).height;
      uStack_40 = 0;
      uStack_3c = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar6 + 1;
        local_88 = (pointer)0x0;
        local_98._4_4_ = uVar6;
        local_98._0_4_ = 1;
        local_98._8_8_ = (ulong)pIVar7->m_array_layers << 0x20;
        lStack_80 = (ulong)local_48 << 0x20;
        uStack_74 = (pIVar7->m_extent).depth;
        uStack_78 = uStack_44;
        uVar8 = -(uint)(1 < (int)local_48 / 2);
        uVar9 = -(uint)(1 < (int)uStack_44 / 2);
        uStack_40 = (int)uStack_40 / 2 & -(uint)(0 < (int)uStack_40 / 2);
        uStack_3c = (int)uStack_3c / 2 & -(uint)(0 < (int)uStack_3c / 2);
        local_48 = ~uVar8 & 1 | (int)local_48 / 2 & uVar8;
        uStack_44 = ~uVar9 & 1 | (int)uStack_44 / 2 & uVar9;
        auStack_60._0_4_ = 0;
        auStack_60._4_4_ = 0;
        auStack_60._8_8_ = (ulong)local_48 << 0x20;
        uStack_4c = (pIVar7->m_extent).depth;
        uStack_50 = uStack_44;
        VStack_70.mipLevel = uVar5;
        VStack_70.aspectMask = 1;
        VStack_70._8_8_ = (ulong)pIVar7->m_array_layers << 0x20;
        VVar4 = 0x1000;
        if (uVar6 == 0) {
          VVar4 = local_b4;
        }
        local_a8._0_8_ = local_98._0_8_;
        local_a8._8_8_ = local_98._8_8_;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_a8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d0,__l_00,&local_f9);
        VVar3 = 0x1000;
        if (uVar6 == 0) {
          VVar3 = local_d4;
        }
        old_layout_00 = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
        if (uVar6 == 0) {
          old_layout_00 = old_layout;
        }
        ImageBase::GetMemoryBarriers
                  (&local_f8,pIVar7,&local_d0,VVar3,0x800,old_layout_00,
                   VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (this->m_command_buffer,VVar4,0x1000,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_f8.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_f8.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_f8.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_f8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pIVar7 = (local_b0->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8._0_4_ = VStack_70.aspectMask;
        local_a8._4_4_ = VStack_70.mipLevel;
        local_a8._8_4_ = VStack_70.baseArrayLayer;
        local_a8._12_4_ = VStack_70.layerCount;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)local_a8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d0,__l_01,&local_f9);
        VVar3 = 0;
        if (uVar6 == 0) {
          VVar3 = local_d4;
        }
        ImageBase::GetMemoryBarriers
                  (&local_f8,pIVar7,&local_d0,VVar3,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (this->m_command_buffer,VVar4,0x1000,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_f8.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_f8.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_f8.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_f8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pPVar2 = local_b0;
        pVVar1 = ((local_b0->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->m_image;
        (*vkCmdBlitImage)(this->m_command_buffer,pVVar1,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,pVVar1,
                          VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,(VkImageBlit *)local_98,
                          VK_FILTER_LINEAR);
        pIVar7 = (pPVar2->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8._0_8_ = local_98._0_8_;
        local_a8._8_8_ = local_98._8_8_;
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_a8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  (&local_d0,__l_02,&local_f9);
        ImageBase::GetMemoryBarriers
                  (&local_f8,pIVar7,&local_d0,0,local_d8,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   new_layout,0xffffffff,0xffffffff);
        (*vkCmdPipelineBarrier)
                  (this->m_command_buffer,0x1000,local_dc,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,
                   (int)((ulong)((long)local_f8.
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_f8.
                                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,
                   local_f8.
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (local_f8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.
            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.
                          super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pIVar7 = (local_b0->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (uVar5 == pIVar7->m_mip_levels - 1) {
          local_a8._0_4_ = VStack_70.aspectMask;
          local_a8._4_4_ = VStack_70.mipLevel;
          local_a8._8_4_ = VStack_70.baseArrayLayer;
          local_a8._12_4_ = VStack_70.layerCount;
          __l_03._M_len = 1;
          __l_03._M_array = (iterator)local_a8;
          std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                    (&local_d0,__l_03,&local_f9);
          ImageBase::GetMemoryBarriers
                    (&local_f8,pIVar7,&local_d0,0x1000,local_d8,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
                     ,new_layout,0xffffffff,0xffffffff);
          (*vkCmdPipelineBarrier)
                    (this->m_command_buffer,0x1000,local_dc,0,0,(VkMemoryBarrier *)0x0,0,
                     (VkBufferMemoryBarrier *)0x0,
                     (int)((ulong)((long)local_f8.
                                         super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f8.
                                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39,
                     local_f8.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          if (local_f8.
              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
              _M_impl.super__Vector_impl_data._M_start != (VkImageMemoryBarrier *)0x0) {
            operator_delete(local_f8.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.
                                  super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.
                                  super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d0.
              super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.
                            super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d0.
                                  super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d0.
                                  super__Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          pIVar7 = (local_b0->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
        }
        uVar8 = uVar6 + 2;
        uVar6 = uVar5;
      } while (uVar8 < pIVar7->m_mip_levels);
    }
  }
  return;
}

Assistant:

void CommandBuffer::CmdGenerateMipmap2D(const Ptr<ImageBase> &image, VkPipelineStageFlags src_stage,
                                        VkPipelineStageFlags dst_stage, VkAccessFlags src_access_mask,
                                        VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                        VkImageLayout new_layout) const {
	if (image->GetMipLevels() == 1) {
		VkImageSubresourceLayers subresource = {};
		subresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		subresource.mipLevel = 0;
		subresource.baseArrayLayer = 0;
		subresource.layerCount = image->GetArrayLayers();
		CmdPipelineBarrier(
		    src_stage, dst_stage, {}, {},
		    image->GetMemoryBarriers({subresource}, src_access_mask, dst_access_mask, old_layout, new_layout));
		return;
	}
	auto mip_width = (int32_t)image->GetExtent().width, mip_height = (int32_t)image->GetExtent().height;
	for (uint32_t i = 1; i < image->GetMipLevels(); ++i) {
		VkImageBlit blit{};
		blit.srcOffsets[0] = {0, 0, 0};
		blit.srcOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.srcSubresource.mipLevel = i - 1;
		blit.srcSubresource.baseArrayLayer = 0;
		blit.srcSubresource.layerCount = image->GetArrayLayers();
		mip_width = std::max(mip_width / 2, 1);
		mip_height = std::max(mip_height / 2, 1);
		blit.dstOffsets[0] = {0, 0, 0};
		blit.dstOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.dstSubresource.mipLevel = i;
		blit.dstSubresource.baseArrayLayer = 0;
		blit.dstSubresource.layerCount = image->GetArrayLayers();

		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers(
		                       {blit.srcSubresource}, i == 1 ? src_access_mask : VK_ACCESS_TRANSFER_WRITE_BIT,
		                       VK_ACCESS_TRANSFER_READ_BIT, i == 1 ? old_layout : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		                       VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL));
		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers({blit.dstSubresource}, i == 1 ? src_access_mask : 0,
		                                            VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
		                                            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL));

		CmdBlitImage(image, image, blit, VK_FILTER_LINEAR);

		CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
		                   image->GetMemoryBarriers({blit.srcSubresource}, 0, dst_access_mask,
		                                            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, new_layout));
		if (i == image->GetMipLevels() - 1) {
			CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
			                   image->GetMemoryBarriers({blit.dstSubresource}, VK_ACCESS_TRANSFER_WRITE_BIT,
			                                            dst_access_mask, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			                                            new_layout));
		}
	}
}